

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum.cc
# Opt level: O3

void __thiscall google::protobuf::compiler::java::EnumGenerator::~EnumGenerator(EnumGenerator *this)

{
  pointer pAVar1;
  pointer ppEVar2;
  
  pAVar1 = (this->aliases_).
           super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pAVar1 != (pointer)0x0) {
    operator_delete(pAVar1);
  }
  ppEVar2 = (this->canonical_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2);
    return;
  }
  return;
}

Assistant:

EnumGenerator::~EnumGenerator() {}